

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

trt_node * trop_read_node(trt_node *__return_storage_ptr__,trt_parent_cache ca,trt_tree_ctx *tc)

{
  ushort uVar1;
  ushort uVar2;
  lysp_node *plVar3;
  byte bVar4;
  lyplg_ext_sprinter_tree_node_override *plVar5;
  void *pvVar6;
  byte *pbVar7;
  size_t sVar8;
  char *pcVar9;
  ushort uVar10;
  byte *__haystack;
  char *pcVar11;
  ulong uVar12;
  lysp_node_leaf *leaf;
  bool bVar13;
  trt_type tVar14;
  trt_iffeatures tVar15;
  
  if (((tc == (trt_tree_ctx *)0x0) || (plVar3 = tc->pn, plVar3 == (lysp_node *)0x0)) ||
     (plVar3->nodetype == 0)) {
    __assert_fail("tc && tc->pn && tc->pn->nodetype != LYS_UNKNOWN",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                  ,0xb7b,
                  "struct trt_node trop_read_node(struct trt_parent_cache, struct trt_tree_ctx *)");
  }
  plVar5 = tro_set_node_overr(tc->lysc_tree,plVar3,'\x01',&tc->plugin_ctx);
  plVar3 = tc->pn;
  (__return_storage_ptr__->name).type = TRD_NODE_ELSE;
  (__return_storage_ptr__->name).keys = '\0';
  *(undefined3 *)&(__return_storage_ptr__->name).field_0x5 = 0;
  (__return_storage_ptr__->name).module_prefix = (char *)0x0;
  (__return_storage_ptr__->name).str = (char *)0x0;
  (__return_storage_ptr__->name).add_opts = (char *)0x0;
  (__return_storage_ptr__->name).opts = (char *)0x0;
  (__return_storage_ptr__->type).type = TRD_TYPE_EMPTY;
  (__return_storage_ptr__->type).str = (char *)0x0;
  (__return_storage_ptr__->iffeatures).type = TRD_IFF_NON_PRESENT;
  (__return_storage_ptr__->iffeatures).str = (char *)0x0;
  __return_storage_ptr__->last_one = '\x01';
  uVar1 = plVar3->nodetype;
  uVar2 = plVar3->flags;
  uVar12 = (ulong)uVar2;
  uVar10 = ca.lys_status;
  if ((uVar1 & 0x3000) == 0) {
    if ((uVar2 & 0x1c) != 0) {
      uVar10 = uVar2;
    }
    if ((ca._0_8_ >> 0x20 & 0x18) == 0) {
      uVar10 = uVar2;
    }
  }
  pcVar11 = "x";
  if ((uVar10 & 8) == 0) {
    pcVar11 = "+";
  }
  pcVar9 = "o";
  if ((uVar10 & 0x10) == 0) {
    pcVar9 = pcVar11;
  }
  __return_storage_ptr__->status = pcVar9;
  if ((plVar5 == (lyplg_ext_sprinter_tree_node_override *)0x0) ||
     (pcVar11 = plVar5->flags, plVar5->flags == (char *)0x0)) {
    pcVar11 = "-w";
    if (((ca.ancestor != TRD_ANCESTOR_RPC_INPUT) &&
        (((uVar1 & 0x1000) == 0 &&
         (pcVar11 = "ro", (ca.ancestor & ~TRD_ANCESTOR_RPC_INPUT) != TRD_ANCESTOR_RPC_OUTPUT)))) &&
       ((uVar1 & 0x2000) == 0)) {
      if ((uVar1 >> 10 & 1) == 0) {
        if ((uVar1 >> 0xb & 1) == 0) {
          if ((uVar1 & 0x300) == 0) {
            pcVar9 = "rw";
            if ((uVar2 & 3) == 0) {
              uVar12 = ca._0_8_ >> 0x30;
              if ((uVar12 & 1) == 0) {
                pcVar9 = "--";
              }
            }
            else if ((uVar2 & 1) == 0) {
              pcVar9 = "--";
            }
            pcVar11 = "ro";
            if ((uVar12 & 2) == 0) {
              pcVar11 = pcVar9;
            }
          }
          else {
            pcVar11 = "-x";
          }
        }
        else {
          pcVar11 = "-u";
        }
      }
      else {
        pcVar11 = "-n";
      }
    }
  }
  __return_storage_ptr__->flags = pcVar11;
  if ((uVar1 & 0x3000) != 0) goto LAB_0018f5e0;
  if ((char)uVar1 < '\0') {
    (__return_storage_ptr__->name).type = TRD_NODE_CASE;
    goto LAB_0018f5e0;
  }
  if ((uVar1 & 2) == 0) {
    if ((((uVar1 & 1) == 0) || (plVar3[1].next == (lysp_node *)0x0)) ||
       (*(char *)&(plVar3[1].next)->parent == '\0')) {
      if ((uVar1 & 0x18) == 0) {
        if (((uVar1 & 0x60) == 0) || ((uVar2 & 0x20) != 0)) {
          if (((uVar1 & 4) == 0) || ((uVar2 & 0x20) != 0)) goto LAB_0018f5e0;
          if ((((ca.last_list != (lysp_node_list *)0x0) &&
               (__haystack = (byte *)(ca.last_list)->key, __haystack != (byte *)0x0)) &&
              (bVar4 = *__haystack, bVar4 != 0)) && (pcVar11 = plVar3->name, pcVar11 != (char *)0x0)
             ) {
            while ((bVar4 != 0 &&
                   (pbVar7 = (byte *)strstr((char *)__haystack,pcVar11), pbVar7 != (byte *)0x0))) {
              if (((pbVar7 == __haystack) || (pbVar7[-1] == 0x20)) &&
                 (sVar8 = strlen(pcVar11), (pbVar7[sVar8] & 0xdf) == 0)) goto LAB_0018f5e0;
              while ((bVar4 & 0xdf) != 0) {
                pbVar7 = __haystack + 1;
                __haystack = __haystack + 1;
                bVar4 = *pbVar7;
              }
              __haystack = __haystack + (bVar4 != 0);
              bVar4 = *__haystack;
            }
          }
        }
        goto LAB_0018f5d5;
      }
      pcVar11 = "*";
    }
    else {
      pcVar11 = "!";
    }
  }
  else {
    (__return_storage_ptr__->name).type = TRD_NODE_CHOICE;
    if ((uVar2 & 0x20) != 0) goto LAB_0018f5e0;
LAB_0018f5d5:
    pcVar11 = "?";
  }
  (__return_storage_ptr__->name).opts = pcVar11;
LAB_0018f5e0:
  if (plVar5 == (lyplg_ext_sprinter_tree_node_override *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    pcVar11 = plVar5->add_opts;
  }
  (__return_storage_ptr__->name).add_opts = pcVar11;
  if (((uVar1 & 0x10) == 0) || (plVar3[1].next == (lysp_node *)0x0)) {
    bVar13 = false;
  }
  else {
    bVar13 = *(char *)&(plVar3[1].next)->parent != '\0';
  }
  (__return_storage_ptr__->name).keys = bVar13;
  (__return_storage_ptr__->name).module_prefix = (char *)0x0;
  (__return_storage_ptr__->name).str = plVar3->name;
  tVar14 = trop_resolve_type(plVar3);
  (__return_storage_ptr__->type).type = tVar14.type;
  (__return_storage_ptr__->type).str = tVar14.str;
  tVar15 = trop_resolve_iffeatures(plVar3);
  (__return_storage_ptr__->iffeatures).type = tVar15.type;
  (__return_storage_ptr__->iffeatures).str = (char *)0x0;
  pvVar6 = tro_next_sibling(plVar3,tc);
  __return_storage_ptr__->last_one = pvVar6 == (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static struct trt_node
trop_read_node(struct trt_parent_cache ca, struct trt_tree_ctx *tc)
{
    const struct lysp_node *pn;
    struct trt_node ret;
    struct lyplg_ext_sprinter_tree_node_override *no;

    assert(tc && tc->pn && tc->pn->nodetype != LYS_UNKNOWN);

    no = tro_set_node_overr(tc->lysc_tree, tc->pn, 1, &tc->plugin_ctx);

    pn = tc->pn;
    ret = TRP_EMPTY_NODE;

    /* <status> */
    ret.status = trop_resolve_status(pn->nodetype, pn->flags, ca.lys_status);

    /* <flags> */
    ret.flags = trop_resolve_flags(pn->nodetype, pn->flags, ca.ancestor, ca.lys_config, no);

    /* set type of the node */
    trop_resolve_node_opts(pn, ca.last_list, &ret.name.type, &ret.name.opts);
    ret.name.add_opts = no && no->add_opts ? no->add_opts : NULL;
    ret.name.keys = (tc->pn->nodetype & LYS_LIST) && trop_list_has_keys(tc->pn);

    /* The parsed tree is not compiled, so no node can be augmented
     * from another module. This means that nodes from the parsed tree
     * will never have the prefix.
     */
    ret.name.module_prefix = NULL;

    /* set node's name */
    ret.name.str = pn->name;

    /* <type> */
    ret.type = trop_resolve_type(pn);

    /* <iffeature> */
    ret.iffeatures = trop_resolve_iffeatures(pn);

    ret.last_one = !tro_next_sibling(pn, tc);

    return ret;
}